

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O0

void __thiscall
spvtools::opt::IRContext::AddCapability
          (IRContext *this,
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          *c)

{
  bool bVar1;
  uint32_t capability;
  Capability cap;
  pointer pIVar2;
  pointer this_00;
  DefUseManager *this_01;
  Module *this_02;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_20;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> *local_18
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> *c_local;
  IRContext *this_local;
  
  local_18 = c;
  c_local = (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             *)this;
  pIVar2 = std::
           unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ::operator->(c);
  capability = opt::Instruction::GetSingleWordInOperand(pIVar2,0);
  AddCombinatorsForCapability(this,capability);
  bVar1 = std::operator!=(&this->feature_mgr_,(nullptr_t)0x0);
  if (bVar1) {
    this_00 = std::
              unique_ptr<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
              ::operator->(&this->feature_mgr_);
    pIVar2 = std::
             unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ::operator->(local_18);
    cap = opt::Instruction::GetSingleWordInOperand(pIVar2,0);
    FeatureManager::AddCapability(this_00,cap);
  }
  bVar1 = AreAnalysesValid(this,kAnalysisBegin);
  if (bVar1) {
    this_01 = get_def_use_mgr(this);
    pIVar2 = std::
             unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ::get(local_18);
    analysis::DefUseManager::AnalyzeInstDefUse(this_01,pIVar2);
  }
  this_02 = module(this);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  unique_ptr(&local_20,local_18);
  Module::AddCapability(this_02,&local_20);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_20);
  return;
}

Assistant:

void IRContext::AddCapability(std::unique_ptr<Instruction>&& c) {
  AddCombinatorsForCapability(c->GetSingleWordInOperand(0));
  if (feature_mgr_ != nullptr) {
    feature_mgr_->AddCapability(
        static_cast<spv::Capability>(c->GetSingleWordInOperand(0)));
  }
  if (AreAnalysesValid(kAnalysisDefUse)) {
    get_def_use_mgr()->AnalyzeInstDefUse(c.get());
  }
  module()->AddCapability(std::move(c));
}